

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::init(QuantNet *this,EVP_PKEY_CTX *ctx)

{
  value_type pLVar1;
  bool bVar2;
  size_type sVar3;
  reference ppLVar4;
  int conv_bottom_blob_count;
  int conv_layer_count;
  Layer *layer_1;
  int i_1;
  Layer *layer;
  int i;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  int local_1c;
  int local_c;
  
  local_c = 0;
  while (iVar6 = local_c,
        sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size(this->layers),
        iVar6 < (int)sVar3) {
    ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (this->layers,(long)local_c);
    pLVar1 = *ppLVar4;
    bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar2) {
      in_stack_ffffffffffffffb8 = &this->input_blobs;
      std::vector<int,_std::allocator<int>_>::operator[](&pLVar1->tops,0);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
    }
    local_c = local_c + 1;
  }
  local_1c = 0;
  while (iVar5 = local_1c,
        sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size(this->layers),
        iVar5 < (int)sVar3) {
    ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (this->layers,(long)local_1c);
    pLVar1 = *ppLVar4;
    bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (((bVar2) ||
        (bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar2)) ||
       (bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar2)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &this->conv_bottom_blobs;
      std::vector<int,_std::allocator<int>_>::operator[](&pLVar1->bottoms,0);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa8 = &this->conv_top_blobs;
      std::vector<int,_std::allocator<int>_>::operator[](&pLVar1->tops,0);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
    }
    local_1c = local_1c + 1;
  }
  std::vector<int,_std::allocator<int>_>::size(&this->conv_layers);
  std::vector<int,_std::allocator<int>_>::size(&this->conv_bottom_blobs);
  std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::resize
            ((vector<QuantBlobStat,_std::allocator<QuantBlobStat>_> *)
             CONCAT44(iVar6,in_stack_ffffffffffffffc0),(size_type)in_stack_ffffffffffffffb8);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(iVar6,in_stack_ffffffffffffffc0),(size_type)in_stack_ffffffffffffffb8);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(iVar6,in_stack_ffffffffffffffc0),(size_type)in_stack_ffffffffffffffb8);
  return 0;
}

Assistant:

int QuantNet::init()
{
    // find all input layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Input")
        {
            input_blobs.push_back(layer->tops[0]);
        }
    }

    // find all conv layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            conv_layers.push_back(i);
            conv_bottom_blobs.push_back(layer->bottoms[0]);
            conv_top_blobs.push_back(layer->tops[0]);
        }
    }

    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();

    quant_blob_stats.resize(conv_bottom_blob_count);
    weight_scales.resize(conv_layer_count);
    bottom_blob_scales.resize(conv_bottom_blob_count);

    return 0;
}